

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

void __thiscall
bssl::MRUQueue<bssl::DTLSRecordNumber,_32UL>::PushBack
          (MRUQueue<bssl::DTLSRecordNumber,_32UL> *this,DTLSRecordNumber t)

{
  size_t sVar1;
  DTLSRecordNumber *pDVar2;
  MRUQueue<bssl::DTLSRecordNumber,_32UL> *this_local;
  DTLSRecordNumber t_local;
  
  sVar1 = InplaceVector<bssl::DTLSRecordNumber,_32UL>::size(&this->storage_);
  if (sVar1 < 0x20) {
    if (this->start_ != '\0') {
      __assert_fail("start_ == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/internal.h"
                    ,100,
                    "void bssl::MRUQueue<bssl::DTLSRecordNumber, 32>::PushBack(T) [T = bssl::DTLSRecordNumber, N = 32]"
                   );
    }
    InplaceVector<bssl::DTLSRecordNumber,_32UL>::PushBack(&this->storage_,t);
  }
  else {
    pDVar2 = operator[](this,0);
    pDVar2->combined_ = t.combined_;
    this->start_ = this->start_ + 1 & 0x1f;
  }
  return;
}

Assistant:

void PushBack(T t) {
    if (storage_.size() < N) {
      assert(start_ == 0);
      storage_.PushBack(std::move(t));
    } else {
      (*this)[0] = std::move(t);
      start_ = (start_ + 1) % N;
    }
  }